

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_adds_a_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  char cVar8;
  
  lVar2 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar3 = (ulong)wt * 0x10;
  bVar5 = *(byte *)((env->active_fpu).fpr + ws);
  bVar1 = *(byte *)((env->active_fpu).fpr + wt);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = '\x7f';
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((env->active_fpu).fpr + wd) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 1);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 1);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = '\x7f';
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 1) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 2);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 2);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = '\x7f';
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 2) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 3);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 3);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar6 = '\x7f';
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 3) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 4);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 4);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 4) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 5);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 5);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 5) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 6);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 6);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 6) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 7);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 7);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar6 = '\x7f';
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 7) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 8);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 8);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 8) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 9);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 9);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 9) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 10);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 10);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 10) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xb);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xb);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xb) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xc);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xd);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xd);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xd) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xe);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = cVar6;
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = cVar8;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + 0xf);
  bVar1 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xf);
  bVar7 = (char)bVar5 >> 7;
  bVar7 = (bVar5 ^ bVar7) - bVar7;
  bVar5 = (char)bVar1 >> 7;
  bVar5 = (bVar1 ^ bVar5) - bVar5;
  cVar8 = bVar5 + bVar7;
  if (0x7f - (ulong)bVar5 <= (ulong)bVar7) {
    cVar8 = '\x7f';
  }
  if ((char)(bVar7 | bVar5) < '\0') {
    cVar8 = '\x7f';
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xf) = cVar8;
  return;
}

Assistant:

void helper_msa_adds_a_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_adds_a_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_adds_a_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_adds_a_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_adds_a_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_adds_a_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_adds_a_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_adds_a_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_adds_a_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_adds_a_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_adds_a_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_adds_a_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_adds_a_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_adds_a_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_adds_a_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_adds_a_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_adds_a_df(DF_BYTE, pws->b[15], pwt->b[15]);
}